

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-output.c
# Opt level: O2

void window_make(wchar_t origin_x,wchar_t origin_y,wchar_t end_x,wchar_t end_y)

{
  wchar_t wVar1;
  region to_clear;
  
  to_clear.col = origin_x;
  to_clear.row = origin_y;
  to_clear.width = end_x - origin_x;
  to_clear.page_rows = end_y - origin_y;
  region_erase(&to_clear);
  Term_putch(origin_x,origin_y,L'\x01',L'+');
  Term_putch(end_x,origin_y,L'\x01',L'+');
  Term_putch(origin_x,end_y,L'\x01',L'+');
  Term_putch(end_x,end_y,L'\x01',L'+');
  for (wVar1 = L'\x01'; wVar1 < end_x - origin_x; wVar1 = wVar1 + L'\x01') {
    Term_putch(origin_x + wVar1,origin_y,L'\x01',L'-');
    Term_putch(origin_x + wVar1,end_y,L'\x01',L'-');
  }
  for (wVar1 = L'\x01'; wVar1 < end_y - origin_y; wVar1 = wVar1 + L'\x01') {
    Term_putch(origin_x,origin_y + wVar1,L'\x01',L'|');
    Term_putch(end_x,origin_y + wVar1,L'\x01',L'|');
  }
  return;
}

Assistant:

void window_make(int origin_x, int origin_y, int end_x, int end_y)
{
	int n;
	region to_clear;

	to_clear.col = origin_x;
	to_clear.row = origin_y;
	to_clear.width = end_x - origin_x;
	to_clear.page_rows = end_y - origin_y;

	region_erase(&to_clear);

	Term_putch(origin_x, origin_y, COLOUR_WHITE, L'+');
	Term_putch(end_x, origin_y, COLOUR_WHITE, L'+');
	Term_putch(origin_x, end_y, COLOUR_WHITE, L'+');
	Term_putch(end_x, end_y, COLOUR_WHITE, L'+');

	for (n = 1; n < (end_x - origin_x); n++) {
		Term_putch(origin_x + n, origin_y, COLOUR_WHITE, L'-');
		Term_putch(origin_x + n, end_y, COLOUR_WHITE, L'-');
	}

	for (n = 1; n < (end_y - origin_y); n++) {
		Term_putch(origin_x, origin_y + n, COLOUR_WHITE, L'|');
		Term_putch(end_x, origin_y + n, COLOUR_WHITE, L'|');
	}
}